

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
am_CList::Remove_Any_Overridden_By(am_CList *this,Am_Slot *slot,Am_Constraint *competing_constraint)

{
  CItem *pCVar1;
  uint uVar2;
  CItem *local_30;
  CItem *current;
  CItem *next;
  Am_Constraint *competing_constraint_local;
  Am_Slot *slot_local;
  am_CList *this_local;
  
  pCVar1 = this->head;
  while (local_30 = pCVar1, local_30 != (CItem *)0x0) {
    pCVar1 = local_30->next;
    uVar2 = (*(local_30->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[0x10])
                      (local_30->value,slot,competing_constraint);
    if ((uVar2 & 1) != 0) {
      Am_Slot::Remove_Constraint(slot,local_30);
    }
  }
  return;
}

Assistant:

void
am_CList::Remove_Any_Overridden_By(const Am_Slot &slot,
                                   Am_Constraint *competing_constraint)
{
  CItem *next;
  for (CItem *current = head; current != nullptr; current = next) {
    next = current->next;
    if (current->value->Is_Overridden_By(slot, competing_constraint))
      // remove it
      slot.Remove_Constraint(current);
  }
}